

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O2

Vec_Vec_t * Saig_ManCexMinComputeReason(Aig_Man_t *pAig,Abc_Cex_t *pCex,int fPiReason)

{
  Vec_Vec_t *vFrameCis;
  Vec_Vec_t *vFramePPs;
  Vec_Vec_t *pVVar1;
  
  if (pCex->nPis != pAig->nTruePis) {
    __assert_fail("pCex->nPis == Saig_ManPiNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                  ,0x1d4,"Vec_Vec_t *Saig_ManCexMinComputeReason(Aig_Man_t *, Abc_Cex_t *, int)");
  }
  if (pCex->nRegs == pAig->nRegs) {
    if ((-1 < pCex->iPo) && (pCex->iPo < pAig->nTruePos)) {
      vFrameCis = Saig_ManCexMinCollectFrameTerms(pAig,pCex);
      vFramePPs = Saig_ManCexMinCollectPhasePriority(pAig,pCex,vFrameCis);
      pVVar1 = Saig_ManCexMinCollectReason(pAig,pCex,vFrameCis,vFramePPs,fPiReason);
      Vec_VecFree(vFramePPs);
      Vec_VecFree(vFrameCis);
      return pVVar1;
    }
    __assert_fail("pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                  ,0x1d6,"Vec_Vec_t *Saig_ManCexMinComputeReason(Aig_Man_t *, Abc_Cex_t *, int)");
  }
  __assert_fail("pCex->nRegs == Saig_ManRegNum(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                ,0x1d5,"Vec_Vec_t *Saig_ManCexMinComputeReason(Aig_Man_t *, Abc_Cex_t *, int)");
}

Assistant:

Vec_Vec_t * Saig_ManCexMinComputeReason( Aig_Man_t * pAig, Abc_Cex_t * pCex, int fPiReason )
{
    Vec_Vec_t * vFrameCis, * vFramePPs, * vFrameReas;
    // sanity checks
    assert( pCex->nPis == Saig_ManPiNum(pAig) );
    assert( pCex->nRegs == Saig_ManRegNum(pAig) );
    assert( pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig) );
    // derive frame terms
    vFrameCis = Saig_ManCexMinCollectFrameTerms( pAig, pCex );
    // derive phase and priority
    vFramePPs = Saig_ManCexMinCollectPhasePriority( pAig, pCex, vFrameCis );
    // derive reasons for property failure
    vFrameReas = Saig_ManCexMinCollectReason( pAig, pCex, vFrameCis, vFramePPs, fPiReason );
    Vec_VecFree( vFramePPs );
    Vec_VecFree( vFrameCis );
    return vFrameReas;
}